

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void HE4(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long in_RSI;
  uint8_t *in_RDI;
  int L;
  int K;
  int J;
  int I;
  int X;
  
  bVar1 = *(byte *)(in_RSI + -2);
  uVar2 = (uint)*(byte *)(in_RSI + -3);
  uVar3 = (uint)*(byte *)(in_RSI + -4);
  uVar4 = (uint)*(byte *)(in_RSI + -5);
  WebPUint32ToMem(in_RDI,((int)((uint)*(byte *)(in_RSI + -1) + (uint)bVar1 * 2 + uVar2 + 2) >> 2 &
                         0xffU) * 0x1010101);
  WebPUint32ToMem(in_RDI + 0x20,
                  ((int)((uint)bVar1 + uVar2 * 2 + uVar3 + 2) >> 2 & 0xffU) * 0x1010101);
  WebPUint32ToMem(in_RDI + 0x40,((int)(uVar2 + uVar3 * 2 + uVar4 + 2) >> 2 & 0xffU) * 0x1010101);
  WebPUint32ToMem(in_RDI + 0x60,((int)(uVar3 + uVar4 * 2 + uVar4 + 2) >> 2 & 0xffU) * 0x1010101);
  return;
}

Assistant:

static void HE4(uint8_t* WEBP_RESTRICT dst, const uint8_t* WEBP_RESTRICT top) {
  const int X = top[-1];
  const int I = top[-2];
  const int J = top[-3];
  const int K = top[-4];
  const int L = top[-5];
  WebPUint32ToMem(dst + 0 * BPS, 0x01010101U * AVG3(X, I, J));
  WebPUint32ToMem(dst + 1 * BPS, 0x01010101U * AVG3(I, J, K));
  WebPUint32ToMem(dst + 2 * BPS, 0x01010101U * AVG3(J, K, L));
  WebPUint32ToMem(dst + 3 * BPS, 0x01010101U * AVG3(K, L, L));
}